

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d.cpp
# Opt level: O0

ggml_cgraph * compute_graph(test_model *model,ggml_gallocr_t allocr)

{
  ggml_cgraph *pgVar1;
  ulong uVar2;
  undefined8 in_RSI;
  long in_RDI;
  int n_threads;
  ggml_cgraph *gf;
  test_model *in_stack_000000a0;
  
  pgVar1 = build_graph(in_stack_000000a0);
  ggml_gallocr_alloc_graph(in_RSI,pgVar1);
  uVar2 = ggml_backend_is_cpu(*(undefined8 *)(in_RDI + 0x10));
  if ((uVar2 & 1) != 0) {
    ggml_backend_cpu_set_n_threads(*(undefined8 *)(in_RDI + 0x10),1);
  }
  ggml_backend_graph_compute(*(undefined8 *)(in_RDI + 0x10),pgVar1);
  return pgVar1;
}

Assistant:

struct ggml_cgraph * compute_graph(const test_model & model, ggml_gallocr_t allocr) {
    struct ggml_cgraph * gf = build_graph(model);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);
    int n_threads = 1;

    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }

    ggml_backend_graph_compute(model.backend, gf);

    //ggml_graph_print(gf);

    return gf;
}